

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O0

ssize_t __thiscall
SocketPP::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  Message local_30;
  string *local_18;
  string *str_local;
  TCPClient *this_local;
  
  local_18 = (string *)CONCAT44(in_register_00000034,__fd);
  str_local = (string *)this;
  Message::Message(&local_30,local_18);
  sVar1 = send(this,(int)&local_30,__buf_00,__n,__flags);
  Message::~Message(&local_30);
  return sVar1;
}

Assistant:

ssize_t TCPClient::send(const std::string& str) {
    return send(Message(str));
}